

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O1

double getAvgLength(Settings *s,Data *d)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar3 = d->ntrkptsum;
  dVar9 = 0.0;
  if (1 < iVar3) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      if (uVar6 == (d->iEndSeg).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5]) {
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      else {
        pdVar1 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar8 = pdVar1[uVar6 + 1] - pdVar1[uVar6];
        dVar7 = pdVar2[uVar6 + 1] - pdVar2[uVar6];
        dVar7 = dVar7 * dVar7 + dVar8 * dVar8;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar9 = dVar9 + dVar7;
      }
      uVar6 = uVar6 + 1;
      iVar3 = d->ntrkptsum;
    } while ((long)uVar6 < (long)iVar3 + -1);
  }
  dVar9 = (dVar9 / (double)iVar3) / s->degPerPix;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average track length = ",0x17);
  poVar4 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," pixels",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return dVar9;
}

Assistant:

double getAvgLength(Settings& s, Data& d)
{
	double lensum = 0;
	unsigned int iseg = 0;
	for (int i = 0; i < d.ntrkptsum - 1; i++)
	{
		if (i == d.iEndSeg[iseg])
		{
			iseg++;
		}
		else
		{
			double len = sqrt(pow(d.lats[i+1] - d.lats[i], 2)
			                + pow(d.lons[i+1] - d.lons[i], 2));
			lensum += len;
			//std::cout << "len = " << len << "\n";
		}
	}

	double lenavg = lensum / d.ntrkptsum;
	double lenavgpix = lenavg / s.degPerPix;

	//std::cout << "lensum    = " << lensum    << std::endl;
	//std::cout << "lenavg    = " << lenavg    << std::endl;
	//std::cout << "lenavgpix / s.r = " << lenavgpix / s.r << std::endl;

	std::cout << "Average track length = " << lenavgpix
			<< " pixels" << std::endl;

	return lenavgpix;
}